

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O3

void append_content(char *file_name,string *s)

{
  iterator iVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__cxx11::string::string((string *)local_68,file_name,(allocator *)&local_88);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&content_abi_cxx11_._M_t,(key_type *)local_68);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  if ((_Rb_tree_header *)iVar1._M_node == &content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"{\n","");
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_40,(ulong)(s->_M_dataplus)._M_p);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 == paVar3) {
      local_78._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_78._8_8_ = plVar2[3];
      local_68._8_8_ = &local_78;
    }
    else {
      local_78._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_68._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar2;
    }
    local_68._16_8_ = plVar2[1];
    *plVar2 = (long)paVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._8_8_ == &local_78) {
      local_50._8_8_ = local_78._8_8_;
      local_68._8_8_ = &local_50;
    }
    local_50._0_8_ = local_78._M_allocated_capacity;
    local_80 = 0;
    local_78._M_allocated_capacity = local_78._M_allocated_capacity & 0xffffffffffffff00;
    local_88 = &local_78;
    local_68._0_8_ = file_name;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<char_const*,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&content_abi_cxx11_,
               (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._8_8_ != &local_50) {
      operator_delete((void *)local_68._8_8_);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    std::__cxx11::string::append((char *)(iVar1._M_node + 2));
    std::__cxx11::string::_M_append((char *)(iVar1._M_node + 2),(ulong)(s->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

static void append_content(const char * file_name, const string & s)
{
  auto it = content.find(file_name);
  if (it == content.end())
    content.insert(make_pair(file_name, string("{\n") + s));
  else
  {
    it->second += ",\n";
    it->second += s;
  }
}